

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec.cpp
# Opt level: O1

void mpp_dec_put_frame(Mpp *mpp,RK_S32 index,HalDecTaskFlag flags)

{
  spinlock_t *lock;
  MppDec pvVar1;
  MppBufSlots pvVar2;
  long *p;
  long lVar3;
  long *plVar4;
  HalTaskGroup pvVar5;
  pthread_mutex_t *__mutex;
  ulong uVar6;
  MppDecVprocCtx *ppvVar7;
  Mpp *pMVar8;
  RK_U32 RVar9;
  MPP_RET MVar10;
  RK_S32 RVar11;
  RK_U32 RVar12;
  uint uVar13;
  int iVar14;
  RK_S64 RVar15;
  MppBuffer pvVar16;
  MppDecImpl *dec;
  MppFrame frame;
  HalTaskHnd hnd;
  MppBuffer buffer;
  MppDecVprocCfg cfg;
  MppFrame local_f0;
  HalTaskHnd local_e8;
  MppDecVprocCtx *local_e0;
  int local_d4;
  HalDecTaskFlag local_d0;
  MppBufSlots local_c8;
  Mpp *local_c0;
  MppBuffer local_b8;
  MppDecVprocCfg local_b0 [8];
  
  pvVar1 = mpp->mDec;
  pvVar2 = *(MppBufSlots *)((long)pvVar1 + 0x30);
  local_f0 = (MppFrame)0x0;
  uVar6 = flags.val >> 1;
  local_d0 = flags;
  local_c0 = mpp;
  if (index < 0) {
    if ((((flags.val & 1) == 0) &&
        (_mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"eos",
                    "mpp_dec_put_frame",0x101), (mpp_debug._3_1_ & 0x10) != 0)) ||
       (((uVar6 & 1) != 0 &&
        (_mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"!change",
                    "mpp_dec_put_frame",0x102), (mpp_debug._3_1_ & 0x10) != 0)))) goto LAB_00149d6f;
    if (*(long *)((long)pvVar1 + 0x218) != 0) {
      pvVar5 = *(HalTaskGroup *)((long)pvVar1 + 0x80);
      local_e8 = (HalTaskHnd)0x0;
      MVar10 = hal_task_get_hnd(pvVar5,0,&local_e8);
      if (MVar10 != MPP_OK) {
        do {
          if (*(int *)((long)pvVar1 + 0x1a8) != 0) {
            return;
          }
          usleep(10000);
          MVar10 = hal_task_get_hnd(pvVar5,0,&local_e8);
        } while (MVar10 != MPP_OK);
      }
      local_b0[0].mpp = (void *)(CONCAT44(index,(int)local_d0.val) & 0xffffffff00000001);
      goto LAB_00149c34;
    }
    local_c8 = pvVar2;
    mpp_frame_init(&local_f0);
    mpp_frame_set_eos(local_f0,(uint)flags.val & 1);
    RVar11 = 0;
  }
  else {
    local_c8 = pvVar2;
    mpp_buf_slot_get_prop(pvVar2,index,SLOT_FRAME_PTR,&local_f0);
    RVar9 = mpp_frame_get_mode(local_f0);
    RVar11 = index;
    if (((RVar9 != 0) && (*(int *)((long)pvVar1 + 0x204) != 0)) &&
       (*(long *)((long)pvVar1 + 0x218) == 0)) {
      local_e0 = (MppDecVprocCtx *)((long)pvVar1 + 0x218);
      local_b0[0].mpp = local_c0;
      local_b0[0].task_group = (HalTaskGroup)0x0;
      MVar10 = dec_vproc_init(local_e0,local_b0);
      if (MVar10 == MPP_OK) {
        RVar12 = dec_vproc_get_version(*local_e0);
        if ((RVar9 == 0xc) && (RVar12 == 1)) {
          mpp_frame_set_mode(local_f0,0);
          ppvVar7 = local_e0;
          uVar13 = *(uint *)((long)pvVar1 + 0xbc) & 0xfffffffd;
          *(uint *)((long)pvVar1 + 0xbc) = uVar13;
          *(uint *)((long)pvVar1 + 0x204) = uVar13;
          if (uVar13 == 0 && *(MppDecVprocCtx *)((long)pvVar1 + 0x218) != (MppDecVprocCtx)0x0) {
            dec_vproc_deinit(*(MppDecVprocCtx *)((long)pvVar1 + 0x218));
            *ppvVar7 = (MppDecVprocCtx)0x0;
          }
          *ppvVar7 = (MppDecVprocCtx)0x0;
        }
        else {
          dec_vproc_set_mode(*(MppDecVprocCtx *)((long)pvVar1 + 0x218),
                             *(MppVprocMode *)((long)pvVar1 + 0x204));
          *(HalTaskGroup *)((long)pvVar1 + 0x80) = local_b0[0].task_group;
          dec_vproc_start(*(MppDecVprocCtx *)((long)pvVar1 + 0x218));
        }
      }
      else {
        *(undefined4 *)((long)pvVar1 + 0x204) = 0;
        *(undefined8 *)((long)pvVar1 + 0x218) = 0;
      }
    }
  }
  local_e0 = (MppDecVprocCtx *)CONCAT44(local_e0._4_4_,RVar11);
  if ((local_f0 != (MppFrame)0x0) ||
     (_mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"frame",
                 "mpp_dec_put_frame",0x128), (mpp_debug._3_1_ & 0x10) == 0)) {
    if ((*(int *)((long)pvVar1 + 0xb8) != 0) && (*(int *)((long)pvVar1 + 0xdc) != 0)) {
      mpp_frame_set_errinfo(local_f0,0);
      mpp_frame_set_discard(local_f0,0);
    }
    if (((uVar6 & 1) == 0) && (*(int *)((long)pvVar1 + 0xb4) != 0)) {
      lock = (spinlock_t *)((long)pvVar1 + 0x2a8);
      local_d4 = index;
      mpp_spinlock_lock(lock);
      p = *(long **)((long)pvVar1 + 0x298);
      if (p == (long *)0x0 || p == (long *)((long)pvVar1 + 0x298)) {
        mpp_spinlock_unlock(lock);
        index = local_d4;
      }
      else {
        lVar3 = *p;
        plVar4 = (long *)p[1];
        *(long **)(lVar3 + 8) = plVar4;
        *plVar4 = lVar3;
        *p = (long)p;
        p[1] = (long)p;
        mpp_spinlock_unlock(lock);
        mpp_frame_set_dts(local_f0,p[3]);
        mpp_frame_set_pts(local_f0,p[2]);
        mpp_mem_pool_put_f("mpp_dec_put_frame",*(MppMemPool *)((long)pvVar1 + 0x290),p);
        index = local_d4;
      }
    }
    mpp_frame_set_info_change(local_f0,(uint)(uVar6 & 0x7fffffff) & 1);
    if (((flags.val & 1) != 0) && (mpp_frame_set_eos(local_f0,1), (local_d0.val & 0xc) != 0)) {
      if ((local_d0.val & 0x10) == 0) {
        mpp_frame_set_discard(local_f0,1);
      }
      else {
        mpp_frame_set_errinfo(local_f0,1);
      }
    }
    *(int *)((long)pvVar1 + 0x288) = *(int *)((long)pvVar1 + 0x288) + 1;
    if (((byte)mpp_dec_debug & 0x20) != 0) {
      RVar15 = mpp_frame_get_pts(local_f0);
      pvVar16 = mpp_frame_get_buffer(local_f0);
      if (pvVar16 == (MppBuffer)0x0) {
        iVar14 = -1;
      }
      else {
        pvVar16 = mpp_frame_get_buffer(local_f0);
        iVar14 = mpp_buffer_get_fd_with_caller(pvVar16,"mpp_dec_put_frame");
      }
      _mpp_log_l(4,"mpp_dec","detail: %p put frm pts %llu fd %d\n","mpp_dec_put_frame",pvVar1,RVar15
                 ,iVar14);
    }
    pMVar8 = local_c0;
    if (*(long *)((long)pvVar1 + 0x218) == 0) {
      __mutex = (pthread_mutex_t *)local_c0->mFrmOut;
      local_b0[0].mpp = (MppFrame)0x0;
      mpp_frame_init(&local_b0[0].mpp);
      mpp_frame_copy(local_b0[0].mpp,local_f0);
      if (((byte)mpp_debug & 2) != 0) {
        RVar15 = mpp_frame_get_pts(local_b0[0].mpp);
        _mpp_log_l(4,"mpp_dec","output frame pts %lld\n",(char *)0x0,RVar15);
      }
      pthread_mutex_lock(__mutex);
      mpp_list::add_at_tail((mpp_list *)&__mutex->__data,local_b0,8);
      pMVar8->mFramePutCount = pMVar8->mFramePutCount + 1;
      pthread_cond_signal((pthread_cond_t *)(__mutex + 1));
      pthread_mutex_unlock(__mutex);
      if (index < 0) {
        mpp_frame_deinit(&local_f0);
      }
      if (*(code **)((long)pvVar1 + 0x110) == (code *)0x0) {
        return;
      }
      (**(code **)((long)pvVar1 + 0x110))
                (*(undefined8 *)((long)pvVar1 + 0x118),
                 *(undefined8 *)(*(long *)((long)pvVar1 + 0x210) + 0xa0),
                 *(undefined4 *)((long)pvVar1 + 0x120),local_b0[0].mpp);
      return;
    }
    pvVar5 = *(HalTaskGroup *)((long)pvVar1 + 0x80);
    local_e8 = (HalTaskHnd)0x0;
    MVar10 = hal_task_get_hnd(pvVar5,0,&local_e8);
    if (MVar10 != MPP_OK) {
      do {
        if (*(int *)((long)pvVar1 + 0x1a8) != 0) {
          local_b8 = (MppBuffer)0x0;
          mpp_buf_slot_get_prop(local_c8,(RK_S32)local_e0,SLOT_BUFFER,&local_b8);
          if (local_b8 == (MppBuffer)0x0) {
            return;
          }
          mpp_buffer_put_with_caller(local_b8,"mpp_dec_put_frame");
          return;
        }
        usleep(10000);
        MVar10 = hal_task_get_hnd(pvVar5,0,&local_e8);
      } while (MVar10 != MPP_OK);
    }
    pvVar2 = local_c8;
    local_b0[0].mpp =
         (void *)CONCAT71(local_b0[0].mpp._1_7_,
                          (char)(uVar6 & 0x7fffffff) * '\x02' & 2U | (byte)local_d0.val & 1 |
                          (byte)local_b0[0].mpp & 0xfc);
    RVar11 = (RK_S32)local_e0;
    local_b0[0].mpp = (void *)CONCAT44((RK_S32)local_e0,local_b0[0].mpp._0_4_);
    if ((uVar6 & 1) == 0) {
      mpp_buf_slot_set_flag(local_c8,(RK_S32)local_e0,SLOT_QUEUE_USE);
      mpp_buf_slot_enqueue(pvVar2,RVar11,QUEUE_DEINTERLACE);
    }
LAB_00149c34:
    hal_task_hnd_set_info(local_e8,local_b0);
    hal_task_hnd_set_status(local_e8,1);
    dec_vproc_signal(*(MppDecVprocCtx *)((long)pvVar1 + 0x218));
    return;
  }
LAB_00149d6f:
  abort();
}

Assistant:

void mpp_dec_put_frame(Mpp *mpp, RK_S32 index, HalDecTaskFlag flags)
{
    MppDecImpl *dec = (MppDecImpl *)mpp->mDec;
    MppBufSlots slots = dec->frame_slots;
    MppFrame frame = NULL;
    RK_U32 eos = flags.eos;
    RK_U32 change = flags.info_change;
    RK_U32 error = flags.parse_err || flags.ref_err;
    RK_U32 refer = flags.used_for_ref;
    RK_U32 fake_frame = 0;

    if (index >= 0) {
        RK_U32 mode = 0;

        mpp_buf_slot_get_prop(slots, index, SLOT_FRAME_PTR, &frame);

        mode = mpp_frame_get_mode(frame);
        if (mode && dec->enable_deinterlace && NULL == dec->vproc) {
            MppDecVprocCfg cfg = { mpp, NULL };
            MPP_RET ret = dec_vproc_init(&dec->vproc, &cfg);
            if (ret) {
                // When iep is failed to open disable deinterlace function to
                // avoid noisy log.
                dec->enable_deinterlace = 0;
                dec->vproc = NULL;
            } else {
                if (dec_vproc_get_version(dec->vproc) == 1 && mode == MPP_FRAME_FLAG_DEINTERLACED) {
                    mpp_frame_set_mode(frame, MPP_FRAME_FLAG_FRAME);
                    /*iep 1 can't no detect DEINTERLACED, direct disable*/
                    dec->cfg.base.enable_vproc &= (~MPP_VPROC_MODE_DETECTION);
                    dec->enable_deinterlace = dec->cfg.base.enable_vproc;
                    if (dec->vproc && !dec->enable_deinterlace) {
                        dec_vproc_deinit(dec->vproc);
                        dec->vproc = NULL;
                    }
                    dec->vproc = NULL;
                } else {
                    /* store current IEP mode */
                    dec_vproc_set_mode(dec->vproc, (MppVprocMode)dec->enable_deinterlace);

                    dec->vproc_tasks = cfg.task_group;
                    dec_vproc_start(dec->vproc);
                }
            }
        }
    } else {
        // when post-process is needed and eos without slot index case
        // we need to create a slot index for it
        mpp_assert(eos);
        mpp_assert(!change);

        if (dec->vproc) {
            HalTaskGroup group = dec->vproc_tasks;
            HalTaskHnd hnd = NULL;
            HalTaskInfo task;
            HalDecVprocTask *vproc_task = &task.dec_vproc;
            MPP_RET ret = MPP_OK;

            do {
                ret = hal_task_get_hnd(group, TASK_IDLE, &hnd);
                if (ret) {
                    if (dec->reset_flag) {
                        return;
                    } else {
                        msleep(10);
                    }
                }
            } while (ret);
            vproc_task->flags.val = 0;
            vproc_task->flags.eos = eos;
            vproc_task->input = index;

            hal_task_hnd_set_info(hnd, &task);
            hal_task_hnd_set_status(hnd, TASK_PROCESSING);
            dec_vproc_signal(dec->vproc);

            return ;
        } else {
            mpp_frame_init(&frame);
            fake_frame = 1;
            index = 0;
        }

        mpp_frame_set_eos(frame, eos);
    }

    mpp_assert(index >= 0);
    mpp_assert(frame);

    if (dec->cfg.base.disable_error && dec->cfg.base.dis_err_clr_mark) {
        mpp_frame_set_errinfo(frame, 0);
        mpp_frame_set_discard(frame, 0);
    }

    if (!change) {
        if (dec->cfg.base.sort_pts) {
            MppPktTs *pkt_ts;

            mpp_spinlock_lock(&dec->ts_lock);
            pkt_ts = list_first_entry_or_null(&dec->ts_link, MppPktTs, link);
            if (pkt_ts)
                list_del_init(&pkt_ts->link);
            mpp_spinlock_unlock(&dec->ts_lock);
            if (pkt_ts) {
                mpp_frame_set_dts(frame, pkt_ts->dts);
                mpp_frame_set_pts(frame, pkt_ts->pts);
                mpp_mem_pool_put(dec->ts_pool, pkt_ts);
            }
        }
    }
    mpp_frame_set_info_change(frame, change);

    if (eos) {
        mpp_frame_set_eos(frame, 1);
        if (error) {
            if (refer)
                mpp_frame_set_errinfo(frame, 1);
            else
                mpp_frame_set_discard(frame, 1);
        }
    }

    dec->dec_out_frame_count++;
    dec_dbg_detail("detail: %p put frm pts %llu fd %d\n", dec,
                   mpp_frame_get_pts(frame),
                   (NULL == mpp_frame_get_buffer(frame)) ? (-1) :
                   mpp_buffer_get_fd(mpp_frame_get_buffer(frame)));

    if (dec->vproc) {
        HalTaskGroup group = dec->vproc_tasks;
        HalTaskHnd hnd = NULL;
        HalTaskInfo task;
        HalDecVprocTask *vproc_task = &task.dec_vproc;
        MPP_RET ret = MPP_OK;

        do {
            ret = hal_task_get_hnd(group, TASK_IDLE, &hnd);
            if (ret) {
                if (dec->reset_flag) {
                    MppBuffer buffer = NULL;
                    mpp_buf_slot_get_prop(slots, index, SLOT_BUFFER, &buffer);
                    if (buffer)
                        mpp_buffer_put(buffer);
                    return;
                } else {
                    msleep(10);
                }
            }
        } while (ret);

        mpp_assert(ret == MPP_OK);

        vproc_task->flags.eos = eos;
        vproc_task->flags.info_change = change;
        vproc_task->input = index;

        if (!change) {
            mpp_buf_slot_set_flag(slots, index, SLOT_QUEUE_USE);
            mpp_buf_slot_enqueue(slots, index, QUEUE_DEINTERLACE);
        }

        hal_task_hnd_set_info(hnd, &task);
        hal_task_hnd_set_status(hnd, TASK_PROCESSING);

        dec_vproc_signal(dec->vproc);
    } else {
        // direct output -> copy a new MppFrame and output
        mpp_list *list = mpp->mFrmOut;
        MppFrame out = NULL;

        mpp_frame_init(&out);
        mpp_frame_copy(out, frame);

        mpp_dbg_pts("output frame pts %lld\n", mpp_frame_get_pts(out));

        list->lock();
        list->add_at_tail(&out, sizeof(out));
        mpp->mFramePutCount++;
        list->signal();
        list->unlock();

        if (fake_frame)
            mpp_frame_deinit(&frame);

        mpp_dec_callback(dec, MPP_DEC_EVENT_ON_FRM_READY, out);
    }
}